

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  long lVar1;
  string *psVar2;
  char cVar3;
  IMutableContext *pIVar4;
  undefined8 *puVar5;
  long *plVar6;
  char *pcVar7;
  ulong *puVar8;
  size_type *psVar9;
  ulong uVar10;
  pointer pcVar11;
  long *local_f8 [2];
  long local_e8 [2];
  string *local_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  undefined1 local_b0 [8];
  string s;
  ulong local_80;
  long lStack_78;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  undefined1 local_50 [8];
  string subs;
  
  local_b0 = (undefined1  [8])&s._M_string_length;
  pcVar11 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar11,pcVar11 + value->_M_string_length);
  pIVar4 = getCurrentMutableContext();
  (*(pIVar4->super_IContext)._vptr_IContext[6])(local_50);
  cVar3 = (**(code **)(*(size_type *)local_50 + 0x58))();
  local_d8 = __return_storage_ptr__;
  if (local_50 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_50 + 0x18))();
  }
  if ((cVar3 != '\0') && (s._M_dataplus._M_p != (pointer)0x0)) {
    psVar9 = &subs._M_string_length;
    pcVar11 = (pointer)0x0;
    do {
      subs._M_dataplus._M_p = (pointer)0x0;
      subs._M_string_length._0_1_ = 0;
      local_50 = (undefined1  [8])psVar9;
      if (*(char *)((long)local_b0 + (long)pcVar11) == '\t') {
        pcVar7 = "\\t";
LAB_001316cd:
        std::__cxx11::string::_M_replace((ulong)local_50,0,(char *)0x0,(ulong)pcVar7);
        if (subs._M_dataplus._M_p != (pointer)0x0) {
          std::__cxx11::string::substr((ulong)local_f8,(ulong)local_b0);
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_f8,(ulong)local_50);
          puVar8 = (ulong *)(plVar6 + 2);
          if ((ulong *)*plVar6 == puVar8) {
            local_80 = *puVar8;
            lStack_78 = plVar6[3];
            s.field_2._8_8_ = &local_80;
          }
          else {
            local_80 = *puVar8;
            s.field_2._8_8_ = (ulong *)*plVar6;
          }
          lVar1 = plVar6[1];
          *plVar6 = (long)puVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          pcVar11 = pcVar11 + 1;
          std::__cxx11::string::substr((ulong)&local_d0,(ulong)local_b0);
          uVar10 = 0xf;
          if ((ulong *)s.field_2._8_8_ != &local_80) {
            uVar10 = local_80;
          }
          if (uVar10 < (ulong)(local_c8 + lVar1)) {
            uVar10 = 0xf;
            if (local_d0 != local_c0) {
              uVar10 = local_c0[0];
            }
            if (uVar10 < (ulong)(local_c8 + lVar1)) goto LAB_001317be;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,s.field_2._8_8_);
          }
          else {
LAB_001317be:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append(s.field_2._M_local_buf + 8,(ulong)local_d0);
          }
          local_70 = &local_60;
          plVar6 = puVar5 + 2;
          if ((long *)*puVar5 == plVar6) {
            local_60 = *plVar6;
            uStack_58 = puVar5[3];
          }
          else {
            local_60 = *plVar6;
            local_70 = (long *)*puVar5;
          }
          local_68 = puVar5[1];
          *puVar5 = plVar6;
          puVar5[1] = 0;
          *(undefined1 *)plVar6 = 0;
          std::__cxx11::string::operator=((string *)local_b0,(string *)&local_70);
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          if (local_d0 != local_c0) {
            operator_delete(local_d0,local_c0[0] + 1);
          }
          if ((ulong *)s.field_2._8_8_ != &local_80) {
            operator_delete((void *)s.field_2._8_8_,local_80 + 1);
          }
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0],local_e8[0] + 1);
          }
        }
      }
      else {
        pcVar7 = "\\n";
        if (*(char *)((long)local_b0 + (long)pcVar11) == '\n') goto LAB_001316cd;
      }
      if (local_50 != (undefined1  [8])psVar9) {
        operator_delete((void *)local_50,
                        CONCAT71(subs._M_string_length._1_7_,(undefined1)subs._M_string_length) + 1)
        ;
      }
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 < s._M_dataplus._M_p);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,"\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  plVar6 = (long *)std::__cxx11::string::append(local_50);
  psVar2 = local_d8;
  (local_d8->_M_dataplus)._M_p = (pointer)&local_d8->field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    lVar1 = plVar6[3];
    (local_d8->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&local_d8->field_2 + 8) = lVar1;
  }
  else {
    (local_d8->_M_dataplus)._M_p = (pointer)*plVar6;
    (local_d8->field_2)._M_allocated_capacity = *psVar9;
  }
  local_d8->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_50 != (undefined1  [8])&subs._M_string_length) {
    operator_delete((void *)local_50,
                    CONCAT71(subs._M_string_length._1_7_,(undefined1)subs._M_string_length) + 1);
  }
  if (local_b0 != (undefined1  [8])&s._M_string_length) {
    operator_delete((void *)local_b0,s._M_string_length + 1);
  }
  return psVar2;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}